

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullStore.cpp
# Opt level: O1

MessageStore * __thiscall FIX::NullStoreFactory::create(NullStoreFactory *this,SessionID *param_1)

{
  MessageStore *pMVar1;
  _func_int **local_20;
  _func_int **pp_Stack_18;
  
  pMVar1 = (MessageStore *)operator_new(0x28);
  pMVar1->_vptr_MessageStore = (_func_int **)&PTR__NullStore_001ee740;
  pMVar1[1]._vptr_MessageStore = (_func_int **)0x100000001;
  DateTime::nowUtc();
  pMVar1[2]._vptr_MessageStore = (_func_int **)&PTR__DateTime_001ed778;
  pMVar1[3]._vptr_MessageStore = local_20;
  pMVar1[4]._vptr_MessageStore = pp_Stack_18;
  pMVar1[2]._vptr_MessageStore = (_func_int **)&PTR__DateTime_001ed798;
  return pMVar1;
}

Assistant:

MessageStore* NullStoreFactory::create( const SessionID& )
{
  return new NullStore();
}